

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall slang::ast::Compilation::forceElaborate(Compilation *this,Symbol *symbol)

{
  Symbol *this_00;
  long in_RDI;
  DiagnosticVisitor visitor;
  DiagnosticVisitor *this_01;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar1;
  bool local_1cc;
  uint32_t in_stack_fffffffffffffe3c;
  size_t *in_stack_fffffffffffffe40;
  Compilation *in_stack_fffffffffffffe48;
  DiagnosticVisitor *in_stack_fffffffffffffe50;
  
  this_00 = (Symbol *)(in_RDI + 0x4d0);
  if (*(int *)(in_RDI + 0x3c) == 0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = *(undefined4 *)(in_RDI + 0x3c);
  }
  this_01 = (DiagnosticVisitor *)&stack0xfffffffffffffe20;
  DiagnosticVisitor::DiagnosticVisitor
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe3c);
  local_1cc = false;
  Symbol::visit<slang::ast::DiagnosticVisitor&>
            (this_00,(DiagnosticVisitor *)CONCAT44(uVar1,in_stack_fffffffffffffdf8));
  DiagnosticVisitor::~DiagnosticVisitor(this_01);
  return;
}

Assistant:

void Compilation::forceElaborate(const Symbol& symbol) {
    SLANG_ASSERT(!isFrozen());
    DiagnosticVisitor visitor(*this, numErrors,
                              options.errorLimit == 0 ? UINT32_MAX : options.errorLimit);
    visitor.visitInstances = false;
    symbol.visit(visitor);
}